

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::FileDescriptorTest_Package_Test::TestBody
          (FileDescriptorTest_Package_Test *this)

{
  string *psVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  internal local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  psVar1 = ((this->super_FileDescriptorTest).foo_file_)->package_;
  local_28._M_str = (psVar1->_M_dataplus)._M_p;
  local_28._M_len = psVar1->_M_string_length;
  pcVar2 = anon_var_dwarf_a22956 + 5;
  testing::internal::CmpHelperEQ<char[1],std::basic_string_view<char,std::char_traits<char>>>
            (local_38,"\"\"","foo_file_->package()",(char (*) [1])(anon_var_dwarf_a22956 + 5),
             &local_28);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x179,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_28._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_28._M_len + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  psVar1 = ((this->super_FileDescriptorTest).bar_file_)->package_;
  local_28._M_str = (psVar1->_M_dataplus)._M_p;
  local_28._M_len = psVar1->_M_string_length;
  testing::internal::CmpHelperEQ<char[12],std::basic_string_view<char,std::char_traits<char>>>
            (local_38,"\"bar_package\"","bar_file_->package()",(char (*) [12])"bar_package",
             &local_28);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x17a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_28._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_28._M_len + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  return;
}

Assistant:

TEST_F(FileDescriptorTest, Package) {
  EXPECT_EQ("", foo_file_->package());
  EXPECT_EQ("bar_package", bar_file_->package());
}